

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O3

mz_bool mz_zip_add_mem_to_archive_file_in_place_v2
                  (char *pZip_filename,char *pArchive_name,void *pBuf,size_t buf_size,void *pComment
                  ,mz_uint16 comment_size,mz_uint level_and_flags,mz_zip_error *pErr)

{
  int iVar1;
  mz_bool mVar2;
  mz_bool mVar3;
  uint flags;
  mz_zip_error mVar4;
  mz_zip_archive zip_archive;
  stat file_stat;
  mz_zip_archive local_138;
  stat local_c0;
  
  local_138.m_archive_size = 0;
  local_138.m_central_directory_file_ofs = 0;
  local_138.m_total_files = 0;
  local_138.m_zip_mode = MZ_ZIP_MODE_INVALID;
  local_138.m_zip_type = MZ_ZIP_TYPE_INVALID;
  local_138.m_last_error = MZ_ZIP_NO_ERROR;
  local_138.m_file_offset_alignment = 0;
  local_138.m_pAlloc = (mz_alloc_func)0x0;
  local_138.m_pFree = (mz_free_func)0x0;
  local_138.m_pRealloc = (mz_realloc_func)0x0;
  local_138.m_pAlloc_opaque = (void *)0x0;
  local_138.m_pRead = (mz_file_read_func)0x0;
  local_138.m_pWrite = (mz_file_write_func)0x0;
  local_138.m_pNeeds_keepalive = (mz_file_needs_keepalive)0x0;
  local_138.m_pIO_opaque = (void *)0x0;
  local_138.m_pState = (mz_zip_internal_state *)0x0;
  flags = 6;
  if (-1 < (int)level_and_flags) {
    flags = level_and_flags;
  }
  if (((pArchive_name == (char *)0x0 || pZip_filename == (char *)0x0) ||
      (pBuf == (void *)0x0 && buf_size != 0)) ||
     (pComment == (void *)0x0 && comment_size != 0 || 10 < (flags & 0xf))) {
    if (pErr == (mz_zip_error *)0x0) {
      return 0;
    }
    *pErr = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  if (*pArchive_name == '/') {
    if (pErr == (mz_zip_error *)0x0) {
      return 0;
    }
    *pErr = MZ_ZIP_INVALID_FILENAME;
    return 0;
  }
  iVar1 = stat(pZip_filename,&local_c0);
  if (iVar1 == 0) {
    mVar2 = mz_zip_reader_init_file_v2(&local_138,pZip_filename,flags | 0x800,0,0);
    if (mVar2 != 0) {
      mVar2 = mz_zip_writer_init_from_reader_v2(&local_138,pZip_filename,flags);
      if (mVar2 == 0) {
        if (pErr != (mz_zip_error *)0x0) {
          *pErr = local_138.m_last_error;
        }
        mz_zip_reader_end_internal(&local_138,0);
        return 0;
      }
      goto LAB_0010deb5;
    }
  }
  else {
    mVar2 = mz_zip_writer_init_file_v2(&local_138,pZip_filename,0,flags);
    if (mVar2 != 0) {
LAB_0010deb5:
      mVar2 = mz_zip_writer_add_mem_ex_v2
                        (&local_138,pArchive_name,pBuf,buf_size,pComment,comment_size,flags,0,0,
                         (time_t *)0x0,(char *)0x0,0,(char *)0x0,0);
      mVar4 = local_138.m_last_error;
      mVar3 = mz_zip_writer_finalize_archive(&local_138);
      if (mVar3 == 0) {
        mVar2 = 0;
      }
      if (mVar3 == 0 && mVar4 == MZ_ZIP_NO_ERROR) {
        mVar4 = local_138.m_last_error;
      }
      mVar3 = mz_zip_writer_end_internal(&local_138,mVar2);
      if (mVar3 == 0) {
        mVar2 = 0;
      }
      if (mVar3 == 0 && mVar4 == MZ_ZIP_NO_ERROR) {
        mVar4 = local_138.m_last_error;
      }
      if ((iVar1 != 0) && (mVar2 == 0)) {
        remove(pZip_filename);
      }
      if (pErr == (mz_zip_error *)0x0) {
        return mVar2;
      }
      *pErr = mVar4;
      return mVar2;
    }
  }
  if (pErr != (mz_zip_error *)0x0) {
    *pErr = local_138.m_last_error;
  }
  return 0;
}

Assistant:

mz_bool mz_zip_add_mem_to_archive_file_in_place_v2(
    const char *pZip_filename, const char *pArchive_name, const void *pBuf,
    size_t buf_size, const void *pComment, mz_uint16 comment_size,
    mz_uint level_and_flags, mz_zip_error *pErr) {
  mz_bool status, created_new_archive = MZ_FALSE;
  mz_zip_archive zip_archive;
  struct MZ_FILE_STAT_STRUCT file_stat;
  mz_zip_error actual_err = MZ_ZIP_NO_ERROR;

  mz_zip_zero_struct(&zip_archive);
  if ((int)level_and_flags < 0)
    level_and_flags = MZ_DEFAULT_LEVEL;

  if ((!pZip_filename) || (!pArchive_name) || ((buf_size) && (!pBuf)) ||
      ((comment_size) && (!pComment)) ||
      ((level_and_flags & 0xF) > MZ_UBER_COMPRESSION)) {
    if (pErr)
      *pErr = MZ_ZIP_INVALID_PARAMETER;
    return MZ_FALSE;
  }

  if (!mz_zip_writer_validate_archive_name(pArchive_name)) {
    if (pErr)
      *pErr = MZ_ZIP_INVALID_FILENAME;
    return MZ_FALSE;
  }

  /* Important: The regular non-64 bit version of stat() can fail here if the
   * file is very large, which could cause the archive to be overwritten. */
  /* So be sure to compile with _LARGEFILE64_SOURCE 1 */
  if (MZ_FILE_STAT(pZip_filename, &file_stat) != 0) {
    /* Create a new archive. */
    if (!mz_zip_writer_init_file_v2(&zip_archive, pZip_filename, 0,
                                    level_and_flags)) {
      if (pErr)
        *pErr = zip_archive.m_last_error;
      return MZ_FALSE;
    }

    created_new_archive = MZ_TRUE;
  } else {
    /* Append to an existing archive. */
    if (!mz_zip_reader_init_file_v2(
            &zip_archive, pZip_filename,
            level_and_flags | MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY, 0,
            0)) {
      if (pErr)
        *pErr = zip_archive.m_last_error;
      return MZ_FALSE;
    }

    if (!mz_zip_writer_init_from_reader_v2(&zip_archive, pZip_filename,
                                           level_and_flags)) {
      if (pErr)
        *pErr = zip_archive.m_last_error;

      mz_zip_reader_end_internal(&zip_archive, MZ_FALSE);

      return MZ_FALSE;
    }
  }

  status =
      mz_zip_writer_add_mem_ex(&zip_archive, pArchive_name, pBuf, buf_size,
                               pComment, comment_size, level_and_flags, 0, 0);
  actual_err = zip_archive.m_last_error;

  /* Always finalize, even if adding failed for some reason, so we have a valid
   * central directory. (This may not always succeed, but we can try.) */
  if (!mz_zip_writer_finalize_archive(&zip_archive)) {
    if (!actual_err)
      actual_err = zip_archive.m_last_error;

    status = MZ_FALSE;
  }

  if (!mz_zip_writer_end_internal(&zip_archive, status)) {
    if (!actual_err)
      actual_err = zip_archive.m_last_error;

    status = MZ_FALSE;
  }

  if ((!status) && (created_new_archive)) {
    /* It's a new archive and something went wrong, so just delete it. */
    int ignoredStatus = MZ_DELETE_FILE(pZip_filename);
    (void)ignoredStatus;
  }

  if (pErr)
    *pErr = actual_err;

  return status;
}